

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

bool dxil_spv::raw_access_structured_can_vectorize
               (Impl *impl,Type *type,Value *index,uint stride,Value *byte_offset,uint vecsize)

{
  bool bVar1;
  uint addr_shift_log2_00;
  bool local_61;
  undefined1 local_60 [8];
  RawBufferAccessSplit split;
  uint alignment;
  uint element_size;
  uint addr_shift_log2;
  uint vecsize_local;
  Value *byte_offset_local;
  uint stride_local;
  Value *index_local;
  Type *type_local;
  Impl *impl_local;
  
  if ((((impl->options).scalar_block_layout & 1U) == 0) && (vecsize == 3)) {
    impl_local._7_1_ = false;
  }
  else {
    addr_shift_log2_00 = raw_buffer_data_type_to_addr_shift_log2(impl,type);
    split.dynamic_index._4_4_ = (1 << ((byte)addr_shift_log2_00 & 0x1f)) * vecsize;
    split.dynamic_index._0_4_ = split.dynamic_index._4_4_ & -split.dynamic_index._4_4_;
    if (((stride & (impl->options).ssbo_alignment - 1) == 0) ||
       (split.dynamic_index._4_4_ <= (uint)split.dynamic_index)) {
      memset(local_60,0,0x18);
      bVar1 = extract_raw_buffer_access_split
                        (index,stride,addr_shift_log2_00,vecsize,(RawBufferAccessSplit *)local_60);
      local_61 = false;
      if (bVar1) {
        local_61 = extract_raw_buffer_access_split
                             (byte_offset,1,addr_shift_log2_00,vecsize,
                              (RawBufferAccessSplit *)local_60);
      }
      impl_local._7_1_ = local_61;
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool raw_access_structured_can_vectorize(
		Converter::Impl &impl, const llvm::Type *type,
		const llvm::Value *index, unsigned stride,
		const llvm::Value *byte_offset,
		unsigned vecsize)
{
	// vec3 vectorization requires scalar block layout always.
	if (!impl.options.scalar_block_layout && vecsize == 3)
		return false;

	unsigned addr_shift_log2 = raw_buffer_data_type_to_addr_shift_log2(impl, type);
	unsigned element_size = (1u << addr_shift_log2) * vecsize;
	unsigned alignment = element_size & -int(element_size);

	// A hypothetical offset buffer must be able to cleanly divide by element_size.
	// If stride aligns properly, we know we will never need offset buffers.
	if ((stride & (impl.options.ssbo_alignment - 1)) != 0)
	{
		// Mostly relevant for vec3 here, where the binding alignment is smaller than element size divider.
		if (element_size > alignment)
			return false;
	}

	RawBufferAccessSplit split = {};
	return extract_raw_buffer_access_split(index, stride, addr_shift_log2, vecsize, split) &&
	       extract_raw_buffer_access_split(byte_offset, 1, addr_shift_log2, vecsize, split);
}